

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O3

BoolInt CPU_IsSupported_AVX2(void)

{
  long lVar1;
  UInt32 UVar2;
  uint uVar3;
  uint in_XCR0;
  
  uVar3 = 0;
  lVar1 = cpuid_Version_info(1);
  if ((((~*(uint *)(lVar1 + 0xc) & 0x18000000) == 0) && (uVar3 = 0, (~in_XCR0 & 6) == 0)) &&
     (UVar2 = z7_x86_cpuid_GetMaxFunc(), 6 < UVar2)) {
    lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar3 = *(uint *)(lVar1 + 4) >> 5 & 1;
  }
  return uVar3;
}

Assistant:

BoolInt CPU_IsSupported_AVX2(void)
{
  if (!CPU_IsSupported_AVX())
    return False;
  if (z7_x86_cpuid_GetMaxFunc() < 7)
    return False;
  {
    UInt32 d[4];
    z7_x86_cpuid(d, 7);
    // printf("\ncpuid(7): ebx=%8x ecx=%8x\n", d[1], d[2]);
    return 1
      & (BoolInt)(d[1] >> 5); // avx2
  }
}